

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O1

void get_num_nodes<long>(ExtIsoForest *model_outputs,long *n_nodes,long *n_terminal,int nthreads)

{
  pointer pvVar1;
  pointer pvVar2;
  pointer pIVar3;
  long lVar4;
  pointer pIVar5;
  long lVar6;
  long lVar7;
  
  pvVar1 = (model_outputs->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (model_outputs->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar4 = (long)pvVar2 - (long)pvVar1 >> 3;
  lVar7 = lVar4 * -0x5555555555555555;
  if (pvVar2 != pvVar1) {
    memset(n_terminal,0,lVar4 * 0x5555555555555558);
    lVar4 = 0;
    do {
      pIVar5 = pvVar1[lVar4].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl.
               super__Vector_impl_data._M_start;
      pIVar3 = pvVar1[lVar4].super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>._M_impl.
               super__Vector_impl_data._M_finish;
      n_nodes[lVar4] = ((long)pIVar3 - (long)pIVar5 >> 3) * -0x1084210842108421;
      if (pIVar3 != pIVar5) {
        lVar6 = n_terminal[lVar4];
        do {
          lVar6 = lVar6 + (ulong)(pIVar5->hplane_left == 0);
          pIVar5 = pIVar5 + 1;
        } while (pIVar5 != pIVar3);
        n_terminal[lVar4] = lVar6;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar7 + (ulong)(lVar7 == 0));
  }
  return;
}

Assistant:

void get_num_nodes(const ExtIsoForest &model_outputs, sparse_ix *restrict n_nodes, sparse_ix *restrict n_terminal, int nthreads) noexcept
{
    std::fill(n_terminal, n_terminal + model_outputs.hplanes.size(), 0);
    #pragma omp parallel for schedule(static) num_threads(nthreads) shared(model_outputs, n_nodes, n_terminal)
    for (size_t_for hplane = 0; hplane <(decltype(hplane)) model_outputs.hplanes.size(); hplane++)
    {
        n_nodes[hplane] = model_outputs.hplanes[hplane].size();
        for (const IsoHPlane &node : model_outputs.hplanes[hplane])
        {
            n_terminal[hplane] += (node.hplane_left == 0);
        }
    }
}